

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O0

int rf_config(rf_dev_t *dev,float freq_mhz,float fdev_khz,int modulation,double data_rate_kbps)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint8_t local_3b;
  undefined1 local_3a;
  byte local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined2 uStack_34;
  uint8_t buf [7];
  uint16_t reg_bitrate;
  uint16_t reg_fdev;
  uint32_t reg_freq;
  int err;
  double data_rate_kbps_local;
  int modulation_local;
  float fdev_khz_local;
  float freq_mhz_local;
  rf_dev_t *dev_local;
  
  _reg_bitrate = _reset(dev);
  if (_reg_bitrate == 0) {
    lVar3 = (long)((freq_mhz * 1e+06) / 61.035156);
    buf._3_4_ = (undefined4)lVar3;
    iVar1 = (int)((fdev_khz * 1000.0) / 61.035156);
    buf._1_2_ = (undefined2)iVar1;
    iVar2 = (int)(32000000.0 / (data_rate_kbps * 1000.0));
    uStack_34 = (undefined2)iVar2;
    local_3b = (uint8_t)((uint)iVar2 >> 8);
    local_3a = (undefined1)iVar2;
    local_39 = (byte)((uint)iVar1 >> 8) & 0x3f;
    local_38 = (undefined1)iVar1;
    local_37 = (undefined1)((ulong)lVar3 >> 0x10);
    local_36 = (undefined1)((ulong)lVar3 >> 8);
    local_35 = (undefined1)lVar3;
    _reg_bitrate = spi_write_regs(dev->fd,'\x03',&local_3b,7);
    if (_reg_bitrate == 0) {
      if (modulation == 1) {
        _reg_bitrate = spi_write_reg(dev->fd,'\x02','\b');
      }
      else {
        _reg_bitrate = spi_write_reg(dev->fd,'\x02','\0');
      }
      if ((((((_reg_bitrate == 0) &&
             (_reg_bitrate = spi_write_reg(dev->fd,'&','\a'), _reg_bitrate == 0)) &&
            (_reg_bitrate = spi_write_reg(dev->fd,',','\0'), _reg_bitrate == 0)) &&
           ((_reg_bitrate = spi_write_reg(dev->fd,'-','\0'), _reg_bitrate == 0 &&
            (_reg_bitrate = spi_write_reg(dev->fd,'.','\x18'), _reg_bitrate == 0)))) &&
          ((_reg_bitrate = spi_write_reg(dev->fd,'7','\0'), _reg_bitrate == 0 &&
           ((_reg_bitrate = spi_write_reg(dev->fd,'8','\0'), _reg_bitrate == 0 &&
            (_reg_bitrate = spi_write_reg(dev->fd,'<',0x8f), _reg_bitrate == 0)))))) &&
         ((_reg_bitrate = rf_set_pa(dev,'\x1f',true), _reg_bitrate == 0 &&
          (_reg_bitrate = _switch_mode(dev,4), _reg_bitrate == 0)))) {
        _reg_bitrate = 0;
      }
    }
  }
  return _reg_bitrate;
}

Assistant:

int rf_config(rf_dev_t *dev,
		float freq_mhz, float fdev_khz,
		int modulation, double data_rate_kbps)
{
	int err = ERR_UNSPEC;

	// reset
	TRY(_reset(dev));

	// Program frequency configuration
	// TODO: range validation...
	uint32_t reg_freq = ((freq_mhz * 1e6) / SX1231_FSTEP);
	uint16_t reg_fdev = ((fdev_khz * 1e3) / SX1231_FSTEP);
	uint16_t reg_bitrate = SX1231_FXOSC / (data_rate_kbps * 1000);
	uint8_t buf[7];

	buf[0] = reg_bitrate >> 8;
	buf[1] = reg_bitrate;
	buf[2] = (reg_fdev >> 8) & 0x3f;
	buf[3] = reg_fdev;
	buf[4] = reg_freq >> 16;
	buf[5] = reg_freq >> 8;
	buf[6] = reg_freq;
	TRY(spi_write_regs(dev->fd, RegBitrateMsb, buf, 2 + 2 + 3));

	// Set modulation
	if (modulation == SX1231_MODULATION_OOK) {
		TRY(spi_write_reg(dev->fd, RegDataModul, 0x08));
	} else {
		TRY(spi_write_reg(dev->fd, RegDataModul, 0x00));
	}

	// Disable CLKOUT
	TRY(spi_write_reg(dev->fd, RegDioMapping2, 0x07));

	// Disable Preamble
	TRY(spi_write_reg(dev->fd, RegPreambleMsb, 0x00));
	TRY(spi_write_reg(dev->fd, RegPreambleLsb, 0x00));

	// Disable sync word
	TRY(spi_write_reg(dev->fd, RegSyncConfig, 0x18));

	// Set to unlimited packet mode
	// crcOn=false, dcFree=none, AddrFilt=none
	TRY(spi_write_reg(dev->fd, RegPacketConfig1, 0x00));
	TRY(spi_write_reg(dev->fd, RegPayloadLength, 0x00));

	// Start TX if FifoNotEmpty
	TRY(spi_write_reg(dev->fd, RegFifoThresh, 0x8f));

	// Configure PA
#ifdef WITH_PA1_DEFAULT
	TRY(rf_set_pa(dev, 0x1f, true));
#else
	TRY(rf_set_pa(dev, 0x1f, false));
#endif

	// TODO: generic: modulation shaping
	// TODO: transmitter: paRamp, over-current(OCP)
	// TODO: test: TcxoInputOn


	// Switch to standby mode
	TRY(_switch_mode(dev, OP_MODE_MODE_STDBY));

	err = ERR_OK;
fail:
	return err;
}